

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_modes(AV1_COMP *cpi,ThreadData_conflict *td,TileInfo *tile,aom_writer *w,int tile_row,
                int tile_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int num_planes_00;
  uint mi_row_00;
  CB_COEFF_BUFFER *pCVar4;
  TokenExtra **in_RCX;
  aom_writer *in_RDX;
  TileInfo *in_RSI;
  AV1_COMP *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  AV1_COMP *unaff_retaddr;
  int in_stack_00000010;
  int in_stack_00000018;
  BLOCK_SIZE in_stack_00000020;
  int mi_col;
  TokenExtra *tok_end;
  TokenExtra *tok;
  TokenInfo *token_info;
  int sb_row_in_tile;
  int mi_row;
  int num_planes;
  int mi_col_end;
  int mi_col_start;
  int mi_row_end;
  int mi_row_start;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  uint in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff74;
  uint in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  TokenInfo *in_stack_ffffffffffffff80;
  int local_74;
  int in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  TileInfo *tile_00;
  AV1_COMP *cpi_00;
  
  mi_row_00 = in_RDX->pos;
  iVar1 = *(int *)&in_RDX->field_0x4;
  iVar2 = *(int *)&in_RDX->buffer;
  iVar3 = *(int *)((long)&in_RDX->buffer + 4);
  tile_00 = in_RSI;
  cpi_00 = in_RDI;
  num_planes_00 = av1_num_planes(&in_RDI->common);
  av1_zero_above_context
            ((AV1_COMMON *)CONCAT44(num_planes_00,in_stack_ffffffffffffffb0),
             (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9c);
  av1_init_above_context
            (&(in_RDI->common).above_contexts,num_planes_00,*(int *)&(in_RDX->ec).buf,
             (MACROBLOCKD *)&in_RSI[0x11].mi_col_start);
  if (((cpi_00->common).delta_q_info.delta_q_present_flag != 0) &&
     (in_RSI[0x1d0].mi_row_end = (cpi_00->common).quant_params.base_qindex,
     (cpi_00->common).delta_q_info.delta_lf_present_flag != 0)) {
    av1_reset_loop_filter_delta((MACROBLOCKD *)&in_RSI[0x11].mi_col_start,num_planes_00);
  }
  for (; (int)mi_row_00 < iVar1; mi_row_00 = ((in_RDI->common).seq_params)->mib_size + mi_row_00) {
    get_token_pointers(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                       ,in_stack_ffffffffffffff74,
                       (TokenExtra **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       (TokenExtra **)0x1f676c);
    av1_zero_left_context((MACROBLOCKD *)0x1f6776);
    for (local_74 = iVar2; local_74 < iVar3;
        local_74 = ((in_RDI->common).seq_params)->mib_size + local_74) {
      in_stack_ffffffffffffff68 = mi_row_00;
      pCVar4 = av1_get_cb_coeff_buffer(cpi_00,mi_row_00,local_74);
      *(CB_COEFF_BUFFER **)&tile_00[699].mi_col_start = pCVar4;
      in_stack_ffffffffffffff78 = (uint)((in_RDI->common).seq_params)->sb_size;
      mi_row_00 = in_stack_ffffffffffffff68;
      write_modes_sb(unaff_retaddr,(ThreadData_conflict *)cpi_00,tile_00,in_RDX,in_RCX,
                     (TokenExtra *)CONCAT44(in_R8D,in_R9D),in_stack_00000010,in_stack_00000018,
                     in_stack_00000020);
    }
  }
  return;
}

Assistant:

static inline void write_modes(AV1_COMP *const cpi, ThreadData *const td,
                               const TileInfo *const tile, aom_writer *const w,
                               int tile_row, int tile_col) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &td->mb.e_mbd;
  const int mi_row_start = tile->mi_row_start;
  const int mi_row_end = tile->mi_row_end;
  const int mi_col_start = tile->mi_col_start;
  const int mi_col_end = tile->mi_col_end;
  const int num_planes = av1_num_planes(cm);

  av1_zero_above_context(cm, xd, mi_col_start, mi_col_end, tile->tile_row);
  av1_init_above_context(&cm->above_contexts, num_planes, tile->tile_row, xd);

  if (cpi->common.delta_q_info.delta_q_present_flag) {
    xd->current_base_qindex = cpi->common.quant_params.base_qindex;
    if (cpi->common.delta_q_info.delta_lf_present_flag) {
      av1_reset_loop_filter_delta(xd, num_planes);
    }
  }

  for (int mi_row = mi_row_start; mi_row < mi_row_end;
       mi_row += cm->seq_params->mib_size) {
    const int sb_row_in_tile =
        (mi_row - tile->mi_row_start) >> cm->seq_params->mib_size_log2;
    const TokenInfo *token_info = &cpi->token_info;
    const TokenExtra *tok;
    const TokenExtra *tok_end;
    get_token_pointers(token_info, tile_row, tile_col, sb_row_in_tile, &tok,
                       &tok_end);

    av1_zero_left_context(xd);

    for (int mi_col = mi_col_start; mi_col < mi_col_end;
         mi_col += cm->seq_params->mib_size) {
      td->mb.cb_coef_buff = av1_get_cb_coeff_buffer(cpi, mi_row, mi_col);
      write_modes_sb(cpi, td, tile, w, &tok, tok_end, mi_row, mi_col,
                     cm->seq_params->sb_size);
    }
    assert(tok == tok_end);
  }
}